

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QRotationGate2<std::complex<double>_>::QRotationGate2
          (QRotationGate2<std::complex<double>_> *this,int qubit0,int qubit1,rotation_type *rot,
          bool fixed)

{
  double dVar1;
  int qubits [2];
  int local_8;
  int local_4;
  
  (this->super_QAdjustable).fixed_ = fixed;
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cfe98;
  dVar1 = (rot->angle_).sin_;
  (this->rotation_).angle_.cos_ = (rot->angle_).cos_;
  (this->rotation_).angle_.sin_ = dVar1;
  _local_8 = CONCAT44(qubit1,qubit0);
  setQubits(this,&local_8);
  return;
}

Assistant:

QRotationGate2( const int qubit0 , const int qubit1 ,
                        const rotation_type& rot , const bool fixed = false )
        : rotation_( rot )
        , QAdjustable( fixed )
        {
          const int qubits[] = { qubit0 , qubit1 } ;
          setQubits( &qubits[0] ) ;
        }